

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  Task *event;
  String *pSVar1;
  RemoveConst<kj::String> *pRVar2;
  String *pSVar3;
  String *pSVar4;
  int iVar5;
  undefined4 extraout_var;
  ArrayDisposer *in_RCX;
  size_t newSize;
  Maybe<kj::Own<kj::TaskSet::Task>_> *pMVar6;
  bool bVar7;
  bool bVar8;
  Vector<kj::String> traces;
  Vector<kj::String> local_78;
  String *local_50;
  String local_48;
  
  local_78.builder.ptr = (String *)0x0;
  local_78.builder.pos = (String *)0x0;
  local_78.builder.endPtr = (String *)0x0;
  pMVar6 = &this->tasks;
  local_50 = __return_storage_ptr__;
  do {
    bVar7 = (pMVar6->ptr).ptr != (Task *)0x0;
    bVar8 = pMVar6 != (Maybe<kj::Own<kj::TaskSet::Task>_> *)0x0;
    if (bVar8 && bVar7) {
      event = (pMVar6->ptr).ptr;
      iVar5 = (**(event->super_Event)._vptr_Event)(event);
      kj::_::traceImpl(&local_48,&event->super_Event,(PromiseNode *)CONCAT44(extraout_var,iVar5));
      if (local_78.builder.pos == local_78.builder.endPtr) {
        newSize = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3) *
                  0x5555555555555556;
        if (local_78.builder.endPtr == local_78.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::String>::setCapacity(&local_78,newSize);
      }
      ((local_78.builder.pos)->content).ptr = local_48.content.ptr;
      ((local_78.builder.pos)->content).size_ = local_48.content.size_;
      ((local_78.builder.pos)->content).disposer = local_48.content.disposer;
      local_78.builder.pos = local_78.builder.pos + 1;
      pMVar6 = &((pMVar6->ptr).ptr)->next;
      in_RCX = local_48.content.disposer;
    }
    pSVar4 = local_50;
  } while (bVar8 && bVar7);
  strArray<kj::Vector<kj::String>&>
            (local_50,(kj *)&local_78,
             (Vector<kj::String> *)"\n============================================\n",(char *)in_RCX
            );
  pSVar3 = local_78.builder.endPtr;
  pRVar2 = local_78.builder.pos;
  pSVar1 = local_78.builder.ptr;
  if (local_78.builder.ptr != (String *)0x0) {
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_78.builder.endPtr = (String *)0x0;
    (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
              (local_78.builder.disposer,pSVar1,0x18,
               ((long)pRVar2 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ((long)pSVar3 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return pSVar4;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<Own<Task>>* ptr = &tasks;
  for (;;) {
    KJ_IF_MAYBE(task, *ptr) {
      traces.add(task->get()->trace());
      ptr = &task->get()->next;
    } else {
      break;
    }
  }